

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall cbtCollisionWorld::~cbtCollisionWorld(cbtCollisionWorld *this)

{
  cbtCollisionObject *pcVar1;
  cbtBroadphaseProxy *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  
  this->_vptr_cbtCollisionWorld = (_func_int **)&PTR__cbtCollisionWorld_00b47d20;
  iVar3 = (this->m_collisionObjects).m_size;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pcVar1 = (this->m_collisionObjects).m_data[lVar4];
      pcVar2 = pcVar1->m_broadphaseHandle;
      if (pcVar2 != (cbtBroadphaseProxy *)0x0) {
        iVar3 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x50))
                  ((long *)CONCAT44(extraout_var,iVar3),pcVar2,this->m_dispatcher1);
        (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[3])
                  (this->m_broadphasePairCache,pcVar2,this->m_dispatcher1);
        pcVar1->m_broadphaseHandle = (cbtBroadphaseProxy *)0x0;
        iVar3 = (this->m_collisionObjects).m_size;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  cbtAlignedObjectArray<cbtCollisionObject_*>::~cbtAlignedObjectArray(&this->m_collisionObjects);
  return;
}

Assistant:

cbtCollisionWorld::~cbtCollisionWorld()
{
	//clean up remaining objects
	int i;
	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* collisionObject = m_collisionObjects[i];

		cbtBroadphaseProxy* bp = collisionObject->getBroadphaseHandle();
		if (bp)
		{
			//
			// only clear the cached algorithms
			//
			getBroadphase()->getOverlappingPairCache()->cleanProxyFromPairs(bp, m_dispatcher1);
			getBroadphase()->destroyProxy(bp, m_dispatcher1);
			collisionObject->setBroadphaseHandle(0);
		}
	}
}